

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

LogStream * __thiscall LogStream::operator<<(LogStream *this,longlong v)

{
  longlong v_local;
  LogStream *this_local;
  
  formatInteger<long_long>(this,v);
  return this;
}

Assistant:

LogStream& LogStream::operator<<(long long v) {
    formatInteger(v);
    return *this;
}